

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

bool tinyusdz::hasEscapedTripleQuotes(string *str,bool is_double_quote,size_t *n)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_38;
  size_t i;
  size_t count;
  size_t *n_local;
  bool is_double_quote_local;
  string *str_local;
  
  i = 0;
  local_38 = 0;
  do {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_38) {
      if (n != (size_t *)0x0) {
        *n = i;
      }
      return i != 0;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if ((*pcVar2 == '\\') && (uVar1 = std::__cxx11::string::size(), local_38 + 3 < uVar1)) {
      if (is_double_quote) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if (((*pcVar2 == '\"') &&
            (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\"')) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\"')) {
          if (n == (size_t *)0x0) {
            return true;
          }
          i = i + 1;
          local_38 = local_38 + 3;
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if (((*pcVar2 == '\'') &&
            (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\'')) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\'')) {
          if (n == (size_t *)0x0) {
            return true;
          }
          i = i + 1;
          local_38 = local_38 + 3;
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool hasEscapedTripleQuotes(const std::string &str, bool is_double_quote,
                            size_t *n) {
  size_t count = 0;

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 3 < str.size()) {
        if (is_double_quote) {
          if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
              (str[i + 3] == '"')) {
            if (!n) {  // early exit
              return true;
            }

            count++;
            i += 3;
          }
        } else {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            if (!n) {  // early exit
              return true;
            }
            count++;
            i += 3;
          }
        }
      }
    }
  }

  if (n) {
    (*n) = count;
  }

  return count > 0;
}